

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O0

bool __thiscall DataRefs::SetCfgValue(DataRefs *this,void *p,int val)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  int *piVar5;
  int in_EDX;
  int *in_RSI;
  int *in_RDI;
  int oldVal;
  int oldLongRefreshIntvl;
  int oldRefreshInvtl;
  string *in_stack_00000398;
  string *in_stack_000003a0;
  int local_38;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  bool local_1;
  
  iVar1 = in_RDI[0x1db];
  iVar2 = in_RDI[0x1dc];
  iVar3 = *in_RSI;
  *in_RSI = in_EDX;
  if ((in_RSI == in_RDI + 0x1db) || (in_RSI == in_RDI + 0x1dc)) {
    if (in_RDI[0x1dc] < in_RDI[0x1db]) {
      in_RDI[0x1dc] = in_RDI[0x1db];
    }
    if (in_RDI[0x1de] < in_RDI[0x1dc]) {
      in_RDI[0x1de] = in_RDI[0x1dc];
    }
  }
  else if (in_RSI == in_RDI + 0x1de) {
    if (in_RDI[0x1de] < in_RDI[0x1db]) {
      in_RDI[0x1de] = in_RDI[0x1db];
    }
    if (in_RDI[0x1de] < in_RDI[0x1dc]) {
      in_RDI[0x1dc] = in_RDI[0x1de];
    }
  }
  else if (in_RSI == in_RDI + 0x1eb) {
    if (in_RDI[0x1eb] + -1000 < in_RDI[0x1ea]) {
      in_stack_ffffffffffffffd4 = 0;
      in_stack_ffffffffffffffd0 = in_RDI[0x1eb] + -1000;
      piVar5 = std::max<int>((int *)&stack0xffffffffffffffd4,(int *)&stack0xffffffffffffffd0);
      in_RDI[0x1ea] = *piVar5;
    }
  }
  else if ((in_RSI == in_RDI + 0x1ea) && (in_RDI[0x1eb] < in_RDI[0x1ea] + 1000)) {
    in_stack_ffffffffffffffcc = 90000;
    local_38 = in_RDI[0x1ea] + 1000;
    piVar5 = std::min<int>((int *)&stack0xffffffffffffffcc,&local_38);
    in_RDI[0x1eb] = *piVar5;
  }
  if (((((((((in_RDI[0x1d7] < 0) || (0xffffff < in_RDI[0x1d7])) || (in_RDI[0x1d8] < 5)) ||
          ((300 < in_RDI[0x1d8] || (in_RDI[0x1cc] < 0)))) || (200 < in_RDI[0x1cc])) ||
        (((in_RDI[0x1d9] < 5 || (100 < in_RDI[0x1d9])) ||
         ((in_RDI[0x1db] < 10 ||
          (((0xb4 < in_RDI[0x1db] || (in_RDI[0x1dc] < in_RDI[0x1db])) || (0xb4 < in_RDI[0x1dc]))))))
        )) || (((in_RDI[0x1de] < in_RDI[0x1dc] || (0xb4 < in_RDI[0x1de])) ||
               ((in_RDI[0x1df] < 1000 ||
                (((100000 < in_RDI[0x1df] || (in_RDI[0x1da] < 0)) ||
                 ((0x32 < in_RDI[0x1da] ||
                  (((in_RDI[0x1e0] < 5 || (in_RDI[0x1e2] < 0)) || (60000.0 < (double)in_RDI[0x1e2]))
                  )))))))))) ||
      (((in_RDI[0x1e5] < 0 || (500 < in_RDI[0x1e5])) ||
       ((in_RDI[0x1e6] < 0 ||
        (((((5000 < in_RDI[0x1e6] || (in_RDI[0x1f9] < 1000)) ||
           ((10000 < in_RDI[0x1f9] ||
            ((((in_RDI[0x1fa] < 5 || (100 < in_RDI[0x1fa])) || (in_RDI[0x1f2] < 0x400)) ||
             ((0xffff < in_RDI[0x1f2] || (in_RDI[499] < 0x400)))))))) || (0xffff < in_RDI[499])) ||
         ((in_RDI[500] < 0x400 || (0xffff < in_RDI[500])))))))))) ||
     ((((in_RDI[0x1f5] < 0 ||
        (((2 < in_RDI[0x1f5] || (in_RDI[0x1ea] < 0)) || (90000 < in_RDI[0x1ea])))) ||
       (((in_RDI[0x1eb] < 0 || (90000 < in_RDI[0x1eb])) || (in_RDI[0x1ec] < 5)))) ||
      (((300 < in_RDI[0x1ec] || (in_RDI[0x1fb] < 0x400)) ||
       (((0xffff < in_RDI[0x1fb] ||
         (((in_RDI[0x1fc] < 0x400 || (0xffff < in_RDI[0x1fc])) || (in_RDI[0x1f0] < 0)))) ||
        (1 < in_RDI[0x1f0])))))))) {
    *in_RSI = iVar3;
    local_1 = false;
  }
  else {
    if (in_RSI == in_RDI + 0x1d3) {
      XPMPSetAircraftLabelDist((float)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
    }
    else if ((in_RSI == in_RDI + 0x1db) && (in_RDI[0x1dd] == iVar1)) {
      in_RDI[0x1dd] = in_RDI[0x1db];
    }
    else if ((in_RSI == in_RDI + 0x1dc) && (in_RDI[0x1dd] == iVar2)) {
      in_RDI[0x1dd] = in_RDI[0x1dc];
    }
    else if (in_RSI == in_RDI + 0x1cc) {
      if (in_RDI[0x1cc] == 0) {
        XPMPSoundEnable(false);
      }
      else {
        bVar4 = XPMPSoundIsEnabled();
        if ((!bVar4) && (0 < *in_RDI)) {
          XPMPSoundEnable(false);
        }
        XPMPSoundSetMasterVolume(0.0);
      }
    }
    if (in_RSI == in_RDI + 0x1f8) {
      if (in_RDI[0x1f8] + 1U < 2) {
        WeatherReset();
      }
      else if (in_RDI[0x1f8] == 1) {
        WeatherSet(in_stack_000003a0,in_stack_00000398);
      }
    }
    LogCfgSetting((void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                  in_stack_ffffffffffffffcc);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool DataRefs::SetCfgValue (void* p, int val)
{
    // If fdSnapTaxiDist changes we might want to enable/disable airport reading
    const int oldRefreshInvtl       = fdRefreshIntvl;
    const int oldLongRefreshIntvl   = fdLongRefrIntvl;
    
    // we don't exactly know which parameter p points to...
    // ...we just set it, validate all of them, and reset in case validation fails
    int oldVal = *reinterpret_cast<int*>(p);
    *reinterpret_cast<int*>(p) = val;
    
    // Setting the refresh intervals or the buffering period
    // might require adapting the other values:
    // refresh intvl <= long refresh intvl <= buffering period
    if (p == &fdRefreshIntvl || p == &fdLongRefrIntvl) {
        if (fdRefreshIntvl > fdLongRefrIntvl)   // long refresh must be at least as long as normal refresh
            fdLongRefrIntvl = fdRefreshIntvl;
        if (fdLongRefrIntvl > fdBufPeriod)      // buf period must be at least as long as long refresh
            fdBufPeriod = fdLongRefrIntvl;
    }
    else if (p == &fdBufPeriod) {
        if (fdRefreshIntvl > fdBufPeriod)       // buf period cannot be smaller than refresh interval
            fdBufPeriod = fdRefreshIntvl;
        if (fdLongRefrIntvl > fdBufPeriod)      // reduce long refresh to buf period
            fdLongRefrIntvl = fdBufPeriod;
    }
    
    // Contrails: Setting the max value will lower the min value, too
    else if (p == &contrailAltMax_ft) {
        if (contrailAltMin_ft > contrailAltMax_ft - 1000)
            contrailAltMin_ft = std::max(0, contrailAltMax_ft - 1000);
    }
    else if (p == &contrailAltMin_ft) {
        if (contrailAltMax_ft < contrailAltMin_ft + 1000)
            contrailAltMax_ft = std::min(90000, contrailAltMin_ft + 1000);
    }
    
    // any configuration value invalid?
    if (labelColor      < 0                 || labelColor       > 0xFFFFFF ||
#ifdef DEBUG
        maxNumAc        < 1                 || maxNumAc         > MAX_NUM_AIRCRAFT   ||
#else
        maxNumAc        < 5                 || maxNumAc         > MAX_NUM_AIRCRAFT   ||
#endif
        volMaster       < 0                 || volMaster        > 200   ||
        fdStdDistance   < 5                 || fdStdDistance    > 100   ||
        fdRefreshIntvl  < 10                || fdRefreshIntvl   > 180   ||
        fdLongRefrIntvl < fdRefreshIntvl    || fdLongRefrIntvl  > 180   ||
        fdBufPeriod     < fdLongRefrIntvl   || fdBufPeriod      > 180   ||
        fdReduceHeight  < 1000              || fdReduceHeight   > 100000||
        fdSnapTaxiDist  < 0                 || fdSnapTaxiDist   > 50    ||
        netwTimeoutMax  < 5                 ||
        hideBelowAGL    < 0                 || hideBelowAGL     > MDL_ALT_MAX ||
        hideNearbyGnd   < 0                 || hideNearbyGnd    > 500   ||
        hideNearbyAir   < 0                 || hideNearbyAir    > 5000  ||
        weatherMaxMETARheight_ft < 1000     || weatherMaxMETARheight_ft > 10000 ||
        weatherMaxMETARdist_nm   <    5     || weatherMaxMETARdist_nm   >   100 ||
        rtListenPort    < 1024              || rtListenPort     > 65535 ||
        rtTrafficPort   < 1024              || rtTrafficPort    > 65535 ||
        rtWeatherPort   < 1024              || rtWeatherPort    > 65535 ||
        rtSTC           < STC_NO_CTRL       || rtSTC            > STC_SIM_TIME_PLUS_BUFFER ||
        contrailAltMin_ft < 0               || contrailAltMin_ft> 90000 ||
        contrailAltMax_ft < 0               || contrailAltMax_ft> 90000 ||
        contrailLifeTime < 5                || contrailLifeTime >   300 ||
        ffListenPort    < 1024              || ffListenPort     > 65535 ||
        ffSendPort      < 1024              || ffSendPort       > 65535 ||
        fscEnv          < 0                 || fscEnv           > 1
        )
    {
        // undo change
        *reinterpret_cast<int*>(p) = oldVal;
        return false;
    }